

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::GLMClassifier::ByteSizeLong(GLMClassifier *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Type *pTVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  uint index;
  
  uVar3 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  uVar8 = (ulong)uVar3;
  index = 0;
  if (uVar8 == 0) {
    uVar8 = 0;
  }
  else {
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                         (&(this->weights_).super_RepeatedPtrFieldBase,index);
      uVar6 = (ulong)(uint)(pTVar4->value_).current_size_;
      lVar7 = uVar6 * 8;
      if (uVar6 == 0) {
        uVar2 = 0;
        uVar6 = 0;
      }
      else {
        uVar2 = (uint)lVar7;
        if ((int)uVar2 < 0) {
          uVar6 = 0xb;
        }
        else {
          iVar1 = 0x1f;
          if ((uVar2 | 1) != 0) {
            for (; (uVar2 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
        }
      }
      pTVar4->_value_cached_byte_size_ = uVar2;
      lVar7 = uVar6 + lVar7;
      uVar2 = (uint)lVar7;
      pTVar4->_cached_size_ = uVar2;
      uVar2 = uVar2 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar8 = uVar8 + lVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar3 != index);
  }
  uVar6 = (ulong)(uint)(this->offset_).current_size_;
  lVar7 = uVar6 * 8;
  if (uVar6 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)lVar7;
    if ((int)uVar3 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    uVar8 = uVar8 + uVar6;
  }
  this->_offset_cached_byte_size_ = uVar3;
  sVar9 = uVar8 + lVar7;
  uVar3 = this->postevaluationtransform_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar8 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar8;
  }
  uVar3 = this->classencoding_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar8 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar8;
  }
  if (this->_oneof_case_[0] == 0x65) {
    sVar5 = Int64Vector::ByteSizeLong((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[0] != 100) goto LAB_001cdb5e;
    sVar5 = StringVector::ByteSizeLong((this->ClassLabels_).stringclasslabels_);
  }
  uVar3 = (uint)sVar5 | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar9 = sVar9 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
LAB_001cdb5e:
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t GLMClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMClassifier)
  size_t total_size = 0;

  // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
  {
    unsigned int count = this->weights_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weights(i));
    }
  }

  // repeated double offset = 2;
  {
    unsigned int count = this->offset_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _offset_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
  if (this->classencoding() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->classencoding());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}